

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O1

void ZeroFillBytes(raw_ostream *OS,size_t Size)

{
  value_type_conflict1 *__x;
  undefined1 auStack_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> FillData;
  
  auStack_38 = (undefined1  [8])0x0;
  FillData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  FillData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (value_type_conflict1 *)
        ((long)&FillData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 7);
  FillData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_38,(iterator)0x0,Size,
             __x);
  llvm::raw_ostream::write(OS,auStack_38._0_4_,(void *)Size,(size_t)__x);
  if (auStack_38 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_38,
                    (long)FillData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_38);
  }
  return;
}

Assistant:

static void ZeroFillBytes(raw_ostream &OS, size_t Size) {
  std::vector<uint8_t> FillData;
  FillData.insert(FillData.begin(), Size, 0);
  OS.write(reinterpret_cast<char *>(FillData.data()), Size);
}